

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void cashew::ValueBuilder::appendDefaultToSwitch(Ref switch_)

{
  Ref *pRVar1;
  ulong uVar2;
  Value *this;
  Value *pVVar3;
  Ref RVar4;
  Ref local_20;
  Ref local_18;
  Value *local_10;
  Ref switch__local;
  
  local_10 = switch_.inst;
  pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&local_10);
  uVar2 = cashew::Ref::operator==(pRVar1,(IString *)&SWITCH);
  if ((uVar2 & 1) == 0) {
    __assert_fail("switch_[0] == SWITCH",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x6eb,"static void cashew::ValueBuilder::appendDefaultToSwitch(Ref)");
  }
  pRVar1 = (Ref *)cashew::Ref::operator[]((uint)&local_10);
  this = Ref::operator->(pRVar1);
  local_20 = makeRawArray(2);
  pVVar3 = Ref::operator->(&local_20);
  RVar4 = makeNull();
  pVVar3 = Value::push_back(pVVar3,RVar4);
  RVar4 = makeRawArray(0);
  pVVar3 = Value::push_back(pVVar3,RVar4);
  Ref::Ref(&local_18,pVVar3);
  Value::push_back(this,local_18);
  return;
}

Assistant:

static void appendDefaultToSwitch(Ref switch_) {
    assert(switch_[0] == SWITCH);
    switch_[2]->push_back(
      &makeRawArray(2)->push_back(makeNull()).push_back(makeRawArray()));
  }